

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::RsRuleSyntax::setChild(RsRuleSyntax *this,size_t index,TokenOrSyntax child)

{
  RandJoinClauseSyntax *pRVar1;
  SyntaxNode *pSVar2;
  RsWeightClauseSyntax *pRVar3;
  long in_RSI;
  long in_RDI;
  SyntaxList<slang::syntax::RsProdSyntax> *in_stack_ffffffffffffffc8;
  SyntaxList<slang::syntax::RsProdSyntax> *in_stack_ffffffffffffffd0;
  
  if (in_RSI == 0) {
    pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x701e8c);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pRVar1 = (RandJoinClauseSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x701e9c);
      pRVar1 = SyntaxNode::as<slang::syntax::RandJoinClauseSyntax>(pSVar2);
    }
    *(RandJoinClauseSyntax **)(in_RDI + 0x18) = pRVar1;
  }
  else if (in_RSI == 1) {
    pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x701ece);
    SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::RsProdSyntax>>(pSVar2);
    SyntaxList<slang::syntax::RsProdSyntax>::operator=
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x701ef3);
    if (pSVar2 == (SyntaxNode *)0x0) {
      pRVar3 = (RsWeightClauseSyntax *)0x0;
    }
    else {
      pSVar2 = TokenOrSyntax::node((TokenOrSyntax *)0x701f03);
      pRVar3 = SyntaxNode::as<slang::syntax::RsWeightClauseSyntax>(pSVar2);
    }
    *(RsWeightClauseSyntax **)(in_RDI + 0x58) = pRVar3;
  }
  return;
}

Assistant:

void RsRuleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: randJoin = child.node() ? &child.node()->as<RandJoinClauseSyntax>() : nullptr; return;
        case 1: prods = child.node()->as<SyntaxList<RsProdSyntax>>(); return;
        case 2: weightClause = child.node() ? &child.node()->as<RsWeightClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}